

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_array.cpp
# Opt level: O1

void __thiscall
VertexArray::add_vertex_buffer(VertexArray *this,shared_ptr<VertexBuffer> *vbo,bool instanced)

{
  ElementType EVar1;
  GLuint GVar2;
  element_type *peVar3;
  pointer pBVar4;
  PFNGLVERTEXATTRIBPOINTERPROC p_Var5;
  uint uVar6;
  GLenum GVar7;
  ulong uVar8;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  long lVar9;
  BufferElement *e;
  pointer pBVar10;
  shared_ptr<VertexBuffer> *psVar11;
  ulong uVar12;
  
  peVar3 = (vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar11 = vbo;
  (*glad_glBindVertexArray)(this->m_id);
  pBVar4 = (peVar3->m_layout).elements.
           super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __addr = extraout_RDX;
  for (pBVar10 = (peVar3->m_layout).elements.
                 super__Vector_base<BufferElement,_std::allocator<BufferElement>_>._M_impl.
                 super__Vector_impl_data._M_start; pBVar10 != pBVar4; pBVar10 = pBVar10 + 1) {
    EVar1 = pBVar10->type;
    if (EVar1 < (UInt3|Float)) {
      if ((0x1ff9fU >> (EVar1 & (UInt3|UInt2)) & 1) == 0) {
        uVar6 = 3;
        if (EVar1 != Mat3) {
          uVar6 = 4;
        }
        uVar12 = (ulong)uVar6;
        lVar9 = 0;
        uVar8 = (ulong)(uVar6 * 4);
        do {
          VertexBuffer::bind((vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,(int)psVar11,__addr,(socklen_t)uVar8);
          p_Var5 = glad_glVertexAttribPointer;
          GVar2 = this->binding_index;
          GVar7 = element_to_shader_type(pBVar10->type);
          uVar8 = (ulong)pBVar10->normalized;
          (*p_Var5)(GVar2,uVar6,GVar7,pBVar10->normalized,(peVar3->m_layout).stride,
                    (void *)((ulong)pBVar10->offset + lVar9));
          (*glad_glEnableVertexAttribArray)(this->binding_index);
          psVar11 = (shared_ptr<VertexBuffer> *)0x1;
          (*glad_glVertexAttribDivisor)(this->binding_index,1);
          this->binding_index = this->binding_index + 1;
          lVar9 = lVar9 + (ulong)(uVar6 * 4);
          uVar12 = uVar12 - 1;
          __addr = extraout_RDX_00;
        } while (uVar12 != 0);
      }
      else {
        VertexBuffer::bind((vbo->super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,(int)psVar11,__addr,EVar1);
        p_Var5 = glad_glVertexAttribPointer;
        EVar1 = pBVar10->type;
        psVar11 = (shared_ptr<VertexBuffer> *)0x0;
        if ((ulong)EVar1 < 0x11) {
          psVar11 = (shared_ptr<VertexBuffer> *)(ulong)*(uint *)(&DAT_0018bed4 + (ulong)EVar1 * 4);
        }
        GVar2 = this->binding_index;
        GVar7 = element_to_shader_type(EVar1);
        (*p_Var5)(GVar2,(GLint)psVar11,GVar7,pBVar10->normalized,(peVar3->m_layout).stride,
                  (void *)(ulong)pBVar10->offset);
        (*glad_glEnableVertexAttribArray)(this->binding_index);
        __addr = extraout_RDX_01;
        if (instanced) {
          psVar11 = (shared_ptr<VertexBuffer> *)0x1;
          (*glad_glVertexAttribDivisor)(this->binding_index,1);
          __addr = extraout_RDX_02;
        }
        this->binding_index = this->binding_index + 1;
      }
    }
  }
  std::vector<std::shared_ptr<VertexBuffer>,_std::allocator<std::shared_ptr<VertexBuffer>_>_>::
  push_back(&this->m_vertexBuffers,vbo);
  return;
}

Assistant:

void VertexArray::add_vertex_buffer(const std::shared_ptr<VertexBuffer>& vbo, 
                                    bool instanced)
{
    const auto& layout = vbo->layout();
    massert(layout.get_elements().size(), "Vertex buffer has no buffer elements!");

    bind();

    for (const auto& e : layout)
    {
        switch(e.type)
        {
            case ElementType::Float: 
            case ElementType::Float2:
            case ElementType::Float3:
            case ElementType::Float4:
            case ElementType::Int:   
            case ElementType::Int2:  
            case ElementType::Int3:  
            case ElementType::Int4:  
            case ElementType::UInt8:
            case ElementType::UInt8_2:
            case ElementType::UInt8_3:
            case ElementType::UInt: 
            case ElementType::UInt2: 
            case ElementType::UInt3: 
            case ElementType::Bool:  
            {
#if OPENGL_VERSION >= 45
                // TODO offset x relativeoffset
                glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                          0, layout.get_stride());
                glEnableVertexArrayAttrib(m_id, binding_index);

                glVertexArrayAttribFormat(m_id, binding_index, 
                                          e.components_count(), 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          e.offset);
                glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                glBindVertexBuffer(binding_index, vbo->ID(), 
                                   0, layout.get_stride());            
                glEnableVertexAttribArray(binding_index);

                glVertexAttribFormat(binding_index, 
                                     e.components_count(), 
                                     element_to_shader_type(e.type),
                                     e.normalized ? GL_TRUE : GL_FALSE, 
                                     e.offset);
                glVertexAttribBinding(binding_index, binding_index);
#else
                vbo->bind();
                glVertexAttribPointer(binding_index, 
                                      e.components_count(), 
                                      element_to_shader_type(e.type),
                                      e.normalized ? GL_TRUE : GL_FALSE, 
                                      layout.get_stride(),
                                      (void*)e.offset);
                glEnableVertexAttribArray(binding_index);
#endif

                if (instanced)
                    glVertexAttribDivisor(binding_index, 1);

                binding_index++;
                break;
            }
            case ElementType::Mat3:  
            case ElementType::Mat4:  
            {
                uint8_t count = e.components_count();
                for (uint8_t i = 0; i < count; ++i)
                {
#if OPENGL_VERSION >= 45
                    glVertexArrayVertexBuffer(m_id, binding_index, vbo->ID(), 
                                              0, layout.get_stride());
                    glEnableVertexArrayAttrib(m_id, binding_index);

                    glVertexArrayAttribFormat(m_id, binding_index, 
                                              count, 
                                              element_to_shader_type(e.type),
                                              e.normalized ? GL_TRUE : GL_FALSE, 
                                              e.offset + i * count * sizeof(float));
                    glVertexArrayAttribBinding(m_id, binding_index, binding_index);
#elif OPENGL_VERSION >= 43
                    glBindVertexBuffer(binding_index, vbo->ID(), 
                                       0, layout.get_stride());            
                    glEnableVertexAttribArray(binding_index);

                    glVertexAttribFormat(binding_index, 
                                         count, 
                                         element_to_shader_type(e.type),
                                         e.normalized ? GL_TRUE : GL_FALSE, 
                                         e.offset + i * count * sizeof(float));
                    glVertexAttribBinding(binding_index, binding_index);
#else
                    vbo->bind();
                    glVertexAttribPointer(binding_index, 
                                          count, 
                                          element_to_shader_type(e.type),
                                          e.normalized ? GL_TRUE : GL_FALSE, 
                                          layout.get_stride(),
                                          (void*)(e.offset + i * count * sizeof(float)));

                    glEnableVertexAttribArray(binding_index);
#endif
                    // Per instance (GLSL vec4 limitation)
                    glVertexAttribDivisor(binding_index, 1);

                    binding_index++;
                }
                break;
            }
            default:
                massert(false, "Unknown buffer element data type!");
        }
    }

    m_vertexBuffers.push_back(vbo);
}